

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O2

void ut::is_false(bool value,LocationInfo *location)

{
  FailedAssertion *this;
  undefined7 in_register_00000039;
  allocator local_39;
  string local_38;
  
  if ((int)CONCAT71(in_register_00000039,value) == 0) {
    return;
  }
  this = (FailedAssertion *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string((string *)&local_38,"Value is not \'false\'!",&local_39);
  FailedAssertion::FailedAssertion(this,&local_38,location);
  __cxa_throw(this,&FailedAssertion::typeinfo,FailedAssertion::~FailedAssertion);
}

Assistant:

inline void is_false(bool value, const LocationInfo &location)
	{
		if (value)
			throw FailedAssertion("Value is not 'false'!", location);
	}